

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::texcoord2f> *value)

{
  bool bVar1;
  storage_t<tinyusdz::value::texcoord2f> in_RAX;
  float2 v;
  storage_t<tinyusdz::value::texcoord2f> local_18;
  
  local_18 = in_RAX;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
  }
  else {
    bVar1 = ParseBasicTypeTuple<float,2ul>(this,(array<float,_2UL> *)&local_18);
    if (!bVar1) {
      return false;
    }
    if (value->has_value_ == false) {
      value->has_value_ = true;
    }
    value->contained = local_18;
  }
  return true;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::texcoord2f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::texcoord2f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}